

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

int fy_node_pair_set_key(fy_node_pair *fynp,fy_node *fyn)

{
  fy_node *pfVar1;
  _Bool _Var2;
  fy_node_pair *pfVar3;
  fy_node *pfVar4;
  int iVar5;
  fy_token *pfVar6;
  
  iVar5 = -1;
  if ((fynp != (fy_node_pair *)0x0) && ((fyn == (fy_node *)0x0 || ((fyn->field_0x34 & 8) == 0)))) {
    pfVar1 = fynp->parent;
    if (pfVar1 == (fy_node *)0x0) {
      fy_node_detach_and_free(fynp->key);
      fynp->key = fyn;
    }
    else {
      if ((pfVar1->field_0x34 & 3) != 2) {
        return -1;
      }
      if (pfVar1->xl == (fy_accel *)0x0) {
        pfVar6 = (pfVar1->field_12).scalar;
        if (pfVar6 != (fy_token *)0x0 && pfVar6 != (fy_token *)&pfVar1->field_12) {
          do {
            if ((pfVar6 != (fy_token *)fynp) &&
               (_Var2 = fy_node_compare_user
                                  (*(fy_node **)&pfVar6->type,fyn,(fy_node_mapping_sort_fn)0x0,
                                   (void *)0x0,(fy_node_scalar_compare_fn)0x0,(void *)0x0), _Var2))
            {
              return -1;
            }
            pfVar6 = (fy_token *)(pfVar6->node).next;
            if (pfVar6 == (fy_token *)&pfVar1->field_12) {
              pfVar6 = (fy_token *)0x0;
            }
          } while (pfVar6 != (fy_token *)0x0);
        }
      }
      else {
        pfVar3 = (fy_node_pair *)fy_accel_lookup(pfVar1->xl,fyn);
        if (pfVar3 != (fy_node_pair *)0x0 && pfVar3 != fynp) {
          return -1;
        }
        fy_accel_remove(pfVar1->xl,fynp->key);
      }
      pfVar1->field_0x34 = pfVar1->field_0x34 | 0x10;
      for (pfVar4 = pfVar1->parent; pfVar4 != (fy_node *)0x0; pfVar4 = pfVar4->parent) {
        pfVar4->field_0x34 = pfVar4->field_0x34 | 0x10;
      }
      fy_node_detach_and_free(fynp->key);
      fynp->key = fyn;
      if (pfVar1->xl != (fy_accel *)0x0) {
        fy_accel_insert(pfVar1->xl,fyn,fynp);
      }
    }
    fyn->field_0x34 = fyn->field_0x34 | 8;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int fy_node_pair_set_key(struct fy_node_pair *fynp, struct fy_node *fyn) {
    struct fy_node *fyn_map;
    struct fy_node_pair *fynpi;

    if (!fynp)
        return -1;

    /* the node must not be attached */
    if (fyn && fyn->attached)
        return -1;

    /* sanity check and duplication check */
    fyn_map = fynp->parent;
    if (fyn_map) {

        /* (in)sanity check */
        if (!fy_node_is_mapping(fyn_map))
            return -1;

        if (fyn_map->xl) {
            /* either we're already on the parent list (and it's OK) */
            /* or we're not and we have a duplicate key */
            fynpi = fy_node_accel_lookup_by_node(fyn_map, fyn);
            if (fynpi && fynpi != fynp)
                return -1;
            /* remove that key */
            fy_accel_remove(fyn_map->xl, fynp->key);
        } else {
            /* check whether the key is a duplicate
			* skipping ourselves since our key gets replaced
			*/
            for (fynpi = fy_node_pair_list_head(&fyn_map->mapping); fynpi;
                 fynpi = fy_node_pair_next(&fyn_map->mapping, fynpi)) {

                if (fynpi != fynp && fy_node_compare(fynpi->key, fyn))
                    return -1;
            }
        }

        fy_node_mark_synthetic(fyn_map);
    }

    fy_node_detach_and_free(fynp->key);
    fynp->key = fyn;

    if (fyn_map && fyn_map->xl)
        fy_accel_insert(fyn_map->xl, fynp->key, fynp);

    fyn->attached = true;

    return 0;
}